

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_columns.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true> __thiscall
duckdb::ColumnHelper::Create(ColumnHelper *this,CatalogEntry *entry)

{
  TableColumnHelper *this_00;
  NotImplementedException *this_01;
  string local_40;
  
  if (entry->type == VIEW_ENTRY) {
    this_00 = (TableColumnHelper *)operator_new(0x10);
    (this_00->super_ColumnHelper)._vptr_ColumnHelper = (_func_int **)&PTR__ColumnHelper_02494788;
    this_00->entry = (TableCatalogEntry *)entry;
  }
  else {
    if (entry->type != TABLE_ENTRY) {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unsupported catalog type for duckdb_columns","");
      NotImplementedException::NotImplementedException(this_01,&local_40);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = (TableColumnHelper *)operator_new(0x40);
    TableColumnHelper::TableColumnHelper(this_00,(TableCatalogEntry *)entry);
  }
  this->_vptr_ColumnHelper = (_func_int **)this_00;
  return (unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>_>)
         (unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>_>)this;
}

Assistant:

unique_ptr<ColumnHelper> ColumnHelper::Create(CatalogEntry &entry) {
	switch (entry.type) {
	case CatalogType::TABLE_ENTRY:
		return make_uniq<TableColumnHelper>(entry.Cast<TableCatalogEntry>());
	case CatalogType::VIEW_ENTRY:
		return make_uniq<ViewColumnHelper>(entry.Cast<ViewCatalogEntry>());
	default:
		throw NotImplementedException("Unsupported catalog type for duckdb_columns");
	}
}